

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

void __thiscall
ctemplate::TemplateCache::ReloadAllIfChanged(TemplateCache *this,ReloadType reload_type)

{
  bool bVar1;
  Strip strip;
  pointer ppVar2;
  char *s;
  TemplateString local_70;
  Template *local_40;
  Template *tpl;
  _Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
  local_30;
  iterator it;
  WriterMutexLock local_20;
  WriterMutexLock ml;
  ReloadType reload_type_local;
  TemplateCache *this_local;
  
  ml.mu_._4_4_ = reload_type;
  WriterMutexLock::WriterMutexLock(&local_20,this->mutex_);
  if ((this->is_frozen_ & 1U) == 0) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
         ::begin(this->parsed_template_cache_);
    while( true ) {
      tpl = (Template *)
            std::
            unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
            ::end(this->parsed_template_cache_);
      bVar1 = std::__detail::operator!=
                        (&local_30,
                         (_Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
                          *)&tpl);
      if (!bVar1) break;
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
                             *)&local_30);
      (ppVar2->second).should_reload = true;
      if (ml.mu_._4_4_ == IMMEDIATE_RELOAD) {
        ppVar2 = std::__detail::
                 _Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
                               *)&local_30);
        local_40 = RefcountedTemplate::tpl((ppVar2->second).refcounted_tpl);
        s = Template::original_filename(local_40);
        TemplateString::TemplateString(&local_70,s);
        strip = Template::strip(local_40);
        ppVar2 = std::__detail::
                 _Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
                               *)&local_30);
        GetTemplateLocked(this,&local_70,strip,&ppVar2->first);
      }
      std::__detail::
      _Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_false,_true>
                    *)&local_30);
    }
    it.
    super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
    ._M_cur._4_4_ = 0;
  }
  else {
    it.
    super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
    ._M_cur._4_4_ = 1;
  }
  WriterMutexLock::~WriterMutexLock(&local_20);
  return;
}

Assistant:

void TemplateCache::ReloadAllIfChanged(ReloadType reload_type) {
  WriterMutexLock ml(mutex_);
  if (is_frozen_) {  // do not reload a frozen cache.
    return;
  }
  for (TemplateMap::iterator it = parsed_template_cache_->begin();
       it != parsed_template_cache_->end();
       ++it) {
    it->second.should_reload = true;
    if (reload_type == IMMEDIATE_RELOAD) {
      const Template* tpl = it->second.refcounted_tpl->tpl();
      // Reload should always use the original filename.
      // For instance on reload, we may replace an existing template with a
      // new one that came earlier on the search path.
      GetTemplateLocked(tpl->original_filename(), tpl->strip(), it->first);
    }
  }
}